

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O2

bool __thiscall tonk::SessionOutgoing::PostDummyDatagram(SessionOutgoing *this)

{
  uint8_t *data;
  atomic<int> *paVar1;
  int *piVar2;
  SimpleCipher *this_00;
  ostringstream *this_01;
  bool bVar3;
  undefined4 uVar4;
  IUDPSender *pIVar5;
  SenderBandwidthControl *pSVar6;
  Channel *pCVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint8_t *puVar10;
  NonceT sequence;
  uint64_t uVar11;
  OutputWorker *this_02;
  uint bytes;
  int iVar12;
  byte bVar13;
  byte bVar14;
  uint nonceBytes;
  LogStringBuffer local_1b8;
  
  if (((this->HasPeerAddress)._M_base._M_i & 1U) == 0) {
    pCVar7 = (this->Deps).Logger;
    if ((int)pCVar7->ChannelMinLevel < 4) {
      local_1b8.ChannelName = pCVar7->ChannelName;
      this_01 = &local_1b8.LogStream;
      local_1b8.LogLevel = Warning;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
      std::operator<<((ostream *)this_01,(string *)&pCVar7->Prefix);
      std::operator<<((ostream *)this_01,"PostDummyDatagram ignored before peer address is known");
      this_02 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_02,&local_1b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
    }
  }
  else {
    local_1b8.ChannelName = (char *)&this->super_OutgoingQueueCommon;
    std::recursive_mutex::lock((recursive_mutex *)local_1b8.ChannelName);
    puVar10 = pktalloc::Allocator::Allocate
                        (&(this->super_OutgoingQueueCommon).WriteAllocator.Allocator,0x553);
    Locker::~Locker((Locker *)&local_1b8);
    if (puVar10 != (uint8_t *)0x0) {
      data = puVar10 + 0x10;
      puVar10[0x10] = '\x12';
      puVar10[0x11] = '%';
      memset(puVar10 + 0x12,0,0x512);
      bVar3 = this->ShouldCompressSequenceNumbers;
      sequence = writeNonce(this,puVar10 + 0x524,(uint *)&local_1b8);
      puVar10 = puVar10 + ((ulong)local_1b8.ChannelName & 0xffffffff) + 0x524;
      bVar13 = (char)local_1b8.ChannelName * '\x04' | bVar3 << 5;
      bVar14 = bVar13 | 0x80;
      if (((this->ShouldAttachHandshake)._M_base._M_i & 1U) != 0) {
        uVar4 = *(undefined4 *)(this->Handshake + 8);
        bVar14 = bVar13 | 0xc0;
        *(undefined8 *)puVar10 = *(undefined8 *)this->Handshake;
        *(undefined4 *)(puVar10 + 8) = uVar4;
        puVar10 = puVar10 + 0xc;
      }
      this_00 = &this->Encryptor;
      puVar10[3] = bVar14;
      bytes = (int)puVar10 - (int)data;
      security::SimpleCipher::Cipher(this_00,data,0x514,sequence);
      uVar8 = security::SimpleCipher::Tag(this_00,data,bytes,sequence);
      iVar12 = bytes + 6;
      uVar11 = siamese::GetTimeUsec();
      uVar9 = security::SimpleCipher::TagInt(this_00,(uint)bVar14 | (int)(uVar11 >> 3) << 8);
      puVar10[2] = (uint8_t)(uVar11 >> 0x13);
      *(short *)puVar10 = (short)(uVar11 >> 3);
      *(uint16_t *)(puVar10 + 4) = uVar9 ^ uVar8;
      pIVar5 = (this->Deps).UDPSender;
      (*pIVar5->_vptr_IUDPSender[2])(pIVar5,&this->PeerUDPAddress,(this->Deps).ConnectionRef);
      pSVar6 = (this->Deps).SenderControl;
      LOCK();
      paVar1 = &pSVar6->AvailableTokens;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i - iVar12;
      UNLOCK();
      piVar2 = &pSVar6->ProbeSendTokens;
      *piVar2 = *piVar2 + iVar12;
      return true;
    }
  }
  return false;
}

Assistant:

bool SessionOutgoing::PostDummyDatagram()
{
    if (!HasPeerAddress)
    {
        Deps.Logger->Warning("PostDummyDatagram ignored before peer address is known");
        return false;
    }

    TONK_DEBUG_ASSERT(protocol::kDummyBytes + protocol::kMaxOverheadBytes < UDPMaxDatagramBytes);

    // Allocate space for queued datagram
    OutgoingQueuedDatagram* datagram = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
        kQueueHeaderBytes + protocol::kDummyBytes + protocol::kMaxOverheadBytes + protocol::kMaxRandomPaddingBytes);
    if (!datagram) {
        return false;
    }

    // No need to call Initialize on the OutgoingQueuedDatagram object

    uint8_t* datagramData = datagram->Data;
    unsigned messageBytes = protocol::kDummyBytes;

    const static unsigned kZeroBytes = protocol::kDummyBytes - protocol::kMessageFrameBytes;
    protocol::WriteMessageFrameHeader(
        datagram->Data,
        protocol::MessageType_Padding,
        kZeroBytes);
    memset(datagram->Data + protocol::kMessageFrameBytes, 0, kZeroBytes);

    // The following code must be kept in sync with sendQueuedDatagram().
    // It is inlined and optimized for this common case:

    // No random padding

    uint8_t* footer = datagramData + messageBytes;
    uint8_t flags = protocol::kConnectionMask;
    if (ShouldCompressSequenceNumbers) {
        flags |= protocol::kSeqCompMask;
    }

    // No reliable sequence number

    // Write packet nonce to header
    unsigned nonceBytes;
    NonceT nonce = writeNonce(footer, nonceBytes);
    flags |= nonceBytes << 2;
    footer += nonceBytes;

    if (ShouldAttachHandshake)
    {
        flags |= protocol::kHandshakeMask;
        const uint32_t b = siamese::ReadU32_LE(Handshake + 8);
        const uint64_t a = siamese::ReadU64_LE(Handshake);
        siamese::WriteU64_LE(footer, a);
        siamese::WriteU32_LE(footer + 8, b);
        footer += protocol::kHandshakeBytes;
    }

    // Tag checksum includes all the data before the timestamp
    const unsigned taggedBytes = (unsigned)(footer - datagramData);

    // Skip over the timestamp
    uint8_t* timestampData = footer;
    footer += protocol::kTimestampBytes;

    // Write flags
    footer[0] = flags;
    ++footer;

    Encryptor.Cipher(datagramData, messageBytes, nonce);

    // Write tag
    uint16_t tag = Encryptor.Tag(datagramData, taggedBytes, nonce);
    static_assert(protocol::kEncryptionTagBytes == 2, "Update this if that changes");
    uint8_t* tagData = footer;

    const unsigned sendBytes = taggedBytes + protocol::kUntaggedDatagramBytes;

    DatagramBuffer datagramBuffer;
    datagramBuffer.AllocatorForFree = &WriteAllocator;
    datagramBuffer.Data = datagramData;
    datagramBuffer.FreePtr = datagram;
    datagramBuffer.Bytes = sendBytes;

    TONK_DEBUG_ASSERT(Deps.UDPSender != nullptr);
    TONK_DEBUG_ASSERT(HasPeerAddress);

#ifdef TONK_DETAILED_STATS
    DetailStats* stats = Deps.Deets->GetWritePtr();
    stats->Stats[Stats_DummyBytesSent] += messageBytes - protocol::kMessageFrameBytes;
    stats->Stats[Stats_FramingBytesSent] += protocol::kMessageFrameBytes;
    stats->Stats[Stats_FootersBytesSent] += sendBytes - messageBytes;
#endif // TONK_DETAILED_STATS

    // Write timestamp and final tag - Reduce noise in timestamp measurements
    const uint64_t nowUsec = siamese::GetTimeUsec();
    const uint32_t timestamp24 = (uint32_t)(nowUsec >> kTime23LostBits);
    tag ^= Encryptor.TagInt(protocol::TimestampFlagTagInt(timestamp24, flags));
    siamese::WriteU24_LE(timestampData, timestamp24);
    siamese::WriteU16_LE(tagData, tag);

    // Send the data
    Deps.UDPSender->Send(
        PeerUDPAddress,
        datagramBuffer,
        Deps.ConnectionRef);

    const unsigned kCompressionSavings = 0;
    const bool kNotReliable = false;

    // Update bandwidth control
    Deps.SenderControl->OnSendDatagram(
        kCompressionSavings,
        sendBytes,
        kNotReliable);

#ifdef TONK_ENABLE_VERBOSE_OUTGOING
    ++m_Recovery;
    Deps.Logger->Info("Recovery sent. Current send rate = ", (float)m_Recovery / (float)m_Reliable);
#endif // TONK_ENABLE_VERBOSE_OUTGOING

    return true;
}